

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

Type __thiscall wasm::Random::pick<wasm::Type>(Random *this,FeatureOptions<wasm::Type> *picker)

{
  uintptr_t uVar1;
  value_type *pvVar2;
  _Vector_base<wasm::Type,_std::allocator<wasm::Type>_> local_30;
  
  items<wasm::Type>((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&local_30,this,picker);
  pvVar2 = pick<std::vector<wasm::Type,std::allocator<wasm::Type>>>
                     (this,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)&local_30);
  uVar1 = pvVar2->id;
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base(&local_30);
  return (Type)uVar1;
}

Assistant:

const T pick(FeatureOptions<T>& picker) {
    return pick(items(picker));
  }